

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::isPreguardContaminated
          (StateQueryMemoryWriteGuard<unsigned_char> *this)

{
  bool bVar1;
  size_t i;
  StateQueryMemoryWriteGuard<unsigned_char> *this_local;
  
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return false;
    }
    if (this->m_preguard != 0xde) break;
    bVar1 = true;
  }
  return true;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isPreguardContaminated (void) const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_preguard)[i] != (deUint8)WRITE_GUARD_VALUE)
			return true;
	return false;
}